

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidyParseFile(TidyDoc tdoc,ctmbstr filnam)

{
  int iVar1;
  TidyDocImpl *doc;
  ctmbstr filnam_local;
  TidyDoc tdoc_local;
  
  iVar1 = tidyDocParseFile((TidyDocImpl *)tdoc,filnam);
  return iVar1;
}

Assistant:

int TIDY_CALL  tidyParseFile( TidyDoc tdoc, ctmbstr filnam )
{
    TidyDocImpl* doc = tidyDocToImpl( tdoc );
    return tidyDocParseFile( doc, filnam );
}